

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash_test_target.cc
# Opt level: O0

uint64_t highwayhash::(anonymous_namespace)::RunHighway<2u>(void *param_1,size_t size)

{
  undefined1 local_4a8 [8];
  HHStateT<2U> state;
  uint64_t local_420;
  HHResult64 result;
  char in [1024];
  size_t size_local;
  void *param_1_local;
  
  result._0_1_ = (undefined1)size;
  in._1016_8_ = size;
  SSE41::HHStateSSE41::HHStateSSE41((HHStateSSE41 *)local_4a8,anon_unknown_0::RunHighway<2U>::key);
  HighwayHashT<highwayhash::SSE41::HHStateSSE41,unsigned_long>
            ((HHStateSSE41 *)local_4a8,(char *)&result,in._1016_8_,&local_420);
  return local_420;
}

Assistant:

uint64_t RunHighway(const void*, const size_t size) {
  HH_ALIGNAS(32) static const HHKey key = {0, 1, 2, 3};
  char in[kMaxBenchmarkInputSize];
  in[0] = static_cast<char>(size & 0xFF);
  HHResult64 result;
  HHStateT<Target> state(key);
  HighwayHashT(&state, in, size, &result);
  return result;
}